

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree.cpp
# Opt level: O3

void __thiscall Block::generate_points(Block *this,size_t n)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  size_t sVar7;
  
  std::vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>::resize(&this->points,n);
  if (n != 0) {
    sVar7 = 0;
    do {
      lVar6 = 0;
      bVar3 = true;
      do {
        bVar5 = bVar3;
        fVar1 = (this->domain).min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.
                m_begin[lVar6];
        fVar2 = (this->domain).max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.
                m_begin[lVar6];
        iVar4 = rand();
        (this->points).super__Vector_base<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>.
        _M_impl.super__Vector_impl_data._M_start[sVar7].coords[lVar6] =
             (fVar2 - fVar1) * (float)(iVar4 % 0x400) * 0.0009765625 + fVar1;
        lVar6 = 1;
        bVar3 = false;
      } while (bVar5);
      sVar7 = sVar7 + 1;
    } while (sVar7 != n);
  }
  return;
}

Assistant:

void            generate_points(size_t n)
  {
    points.resize(n);
    for (size_t i = 0; i < n; ++i)
      for (unsigned j = 0; j < DIM; ++j)
      {
        float min = domain.min[j];
        float max = domain.max[j];
        float u = float(rand() % 1024) / 1024;
        points[i][j] = min + u * (max - min);
      }
  }